

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

void __thiscall CVmRun::throw_new_rtesub(CVmRun *this,vm_obj_id_t cls,uint argc,int errnum)

{
  CVmRun *this_00;
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  
  pvVar2 = sp_;
  if (cls == 0) {
    err_throw(errnum);
  }
  this_00 = (CVmRun *)(sp_ + 1);
  pvVar1 = &sp_->typ;
  sp_ = (vm_val_t *)this_00;
  *pvVar1 = VM_INT;
  (pvVar2->val).intval = errnum;
  throw_new_class(this_00,cls,argc + 1,(char *)0x0);
}

Assistant:

void CVmRun::throw_new_rtesub(VMG_ vm_obj_id_t cls, uint argc, int errnum)
{
    /* if the subclass is defined, create an instance and throw it */
    if (cls != VM_INVALID_OBJ)
    {
        /* push the error number as the first argument */
        push_int(vmg_ errnum);

        /* throw the subclass error */
        throw_new_class(vmg_ cls, argc + 1, 0);
    }

    /* the subclass isn't defined, so throw a generic RuntimeError */
    err_throw(errnum);
}